

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

int mu_check_clip(mu_Context *ctx,mu_Rect r)

{
  mu_Rect mVar1;
  undefined4 local_38;
  undefined4 uStack_34;
  mu_Rect cr;
  mu_Context *ctx_local;
  undefined4 uStack_18;
  mu_Rect r_local;
  
  mVar1 = mu_get_clip_rect(ctx);
  ctx_local._4_4_ = r.x;
  local_38 = mVar1.x;
  cr.x = mVar1.w;
  if ((((local_38 + cr.x < ctx_local._4_4_) ||
       (r_local.x = r.w, ctx_local._4_4_ + r_local.x < local_38)) ||
      (uStack_18 = r.y, uStack_34 = mVar1.y, cr.y = mVar1.h, uStack_34 + cr.y < uStack_18)) ||
     (r_local.y = r.h, uStack_18 + r_local.y < uStack_34)) {
    r_local.w = 2;
  }
  else if (((ctx_local._4_4_ < local_38) || (local_38 + cr.x < ctx_local._4_4_ + r_local.x)) ||
          ((uStack_18 < uStack_34 || (uStack_34 + cr.y < uStack_18 + r_local.y)))) {
    r_local.w = 1;
  }
  else {
    r_local.w = 0;
  }
  return r_local.w;
}

Assistant:

int mu_check_clip(mu_Context *ctx, mu_Rect r) {
  mu_Rect cr = mu_get_clip_rect(ctx);
  if (r.x > cr.x + cr.w || r.x + r.w < cr.x ||
      r.y > cr.y + cr.h || r.y + r.h < cr.y   ) { return MU_CLIP_ALL; }
  if (r.x >= cr.x && r.x + r.w <= cr.x + cr.w &&
      r.y >= cr.y && r.y + r.h <= cr.y + cr.h ) { return 0; }
  return MU_CLIP_PART;
}